

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * google::protobuf::CEscape(string *__return_storage_ptr__,string *src)

{
  string *in_RCX;
  StringPiece src_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  src_00.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  src_00.ptr_ = (char *)src->_M_string_length;
  CEscapeAndAppend((protobuf *)(src->_M_dataplus)._M_p,src_00,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(const std::string &src) {
  std::string dest;
  CEscapeAndAppend(src, &dest);
  return dest;
}